

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

int __thiscall
CGameControllerCTF::OnCharacterDeath
          (CGameControllerCTF *this,CCharacter *pVictim,CPlayer *pKiller,int WeaponID)

{
  int iVar1;
  CCharacter *pCVar2;
  CPlayer *this_00;
  undefined4 in_ECX;
  IGameController *in_RDX;
  CCharacter *in_RSI;
  IGameController *in_RDI;
  CFlag *F;
  int i;
  int HadFlag;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CCharacter *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  CGameContext *this_01;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  IGameController::OnCharacterDeath
            (in_RDX,(CCharacter *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (CPlayer *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  uVar4 = 0;
  for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
    this_01 = *(CGameContext **)(in_RDI[1].m_aTeamSize + (long)iVar3 * 2 + -8);
    if ((this_01 != (CGameContext *)0x0) && (in_RDX != (IGameController *)0x0)) {
      pCVar2 = CPlayer::GetCharacter
                         ((CPlayer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (pCVar2 != (CCharacter *)0x0) {
        in_stack_ffffffffffffffc0 = CFlag::GetCarrier((CFlag *)this_01);
        pCVar2 = CPlayer::GetCharacter
                           ((CPlayer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
        if (in_stack_ffffffffffffffc0 == pCVar2) {
          uVar4 = uVar4 | 2;
        }
      }
    }
    if (this_01 != (CGameContext *)0x0) {
      pCVar2 = CFlag::GetCarrier((CFlag *)this_01);
      if (pCVar2 == in_RSI) {
        IGameController::GameServer(in_RDI);
        CGameContext::SendGameMsg(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        CFlag::Drop((CFlag *)in_stack_ffffffffffffffc0);
        if (in_RDX != (IGameController *)0x0) {
          in_stack_ffffffffffffffbc = CPlayer::GetTeam((CPlayer *)in_RDX);
          this_00 = CCharacter::GetPlayer(in_RSI);
          iVar1 = CPlayer::GetTeam(this_00);
          if (in_stack_ffffffffffffffbc != iVar1) {
            in_RDX->m_aaSpawnPoints[1][0x21].field_0 =
                 (anon_union_4_2_94730284_for_vector2_base<float>_1)
                 (in_RDX->m_aaSpawnPoints[1][0x21].field_0 + 1);
          }
        }
        uVar4 = uVar4 | 1;
      }
    }
  }
  return uVar4;
}

Assistant:

int CGameControllerCTF::OnCharacterDeath(CCharacter *pVictim, CPlayer *pKiller, int WeaponID)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, WeaponID);
	int HadFlag = 0;

	// drop flags
	for(int i = 0; i < 2; i++)
	{
		CFlag *F = m_apFlags[i];
		if(F && pKiller && pKiller->GetCharacter() && F->GetCarrier() == pKiller->GetCharacter())
			HadFlag |= 2;
		if(F && F->GetCarrier() == pVictim)
		{
			GameServer()->SendGameMsg(GAMEMSG_CTF_DROP, -1);
			F->Drop();

			if(pKiller && pKiller->GetTeam() != pVictim->GetPlayer()->GetTeam())
				pKiller->m_Score++;

			HadFlag |= 1;
		}
	}

	return HadFlag;
}